

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.hpp
# Opt level: O3

void ixy::
     printList<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,std::ios_base&(&)(std::ios_base&)>,unsigned_int_const&>,char_const*>,unsigned_int_const&>,char_const*>,unsigned_int_const&>,char_const*>,unsigned_int_const&>,char_const*>,unsigned_int_const&>,char_const*>
               (ostream *os,
               Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_std::ios_base_&(&)(std::ios_base_&)>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_int_&>,_const_char_*>
               *data)

{
  char *__s;
  size_t sVar1;
  
  printList<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,std::ios_base&(&)(std::ios_base&)>,unsigned_int_const&>,char_const*>,unsigned_int_const&>,char_const*>,unsigned_int_const&>,char_const*>,unsigned_int_const&>,char_const*>
            (os,(Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_std::ios_base_&(&)(std::ios_base_&)>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_int_&>,_const_char_*>
                 *)data);
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  __s = data->second;
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
    return;
  }
  std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  return;
}

Assistant:

void printList(std::ostream &os, const Pair<Begin, Last> &data) {
    printList(os, data.first);
    os << data.second;
}